

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintFileDescriptor(Generator *this)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  string *psVar4;
  mapped_type *pmVar5;
  Generator *this_00;
  FileOptions *serialized_options;
  FileDescriptor *pFVar6;
  long in_RDI;
  string module_alias_1;
  int i_1;
  string module_alias;
  int i;
  char file_descriptor_template [142];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  int in_stack_fffffffffffffcbc;
  string *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  MessageLite *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Printer *this_01;
  Printer *this_02;
  undefined8 in_stack_fffffffffffffd38;
  Syntax syntax;
  string *in_stack_fffffffffffffd98;
  int local_244;
  string local_240 [36];
  int local_21c;
  string local_218 [175];
  allocator<char> local_169;
  string local_168 [8];
  char *in_stack_fffffffffffffea0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffea8;
  Printer *in_stack_fffffffffffffeb0;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator local_101;
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [88];
  
  syntax = (Syntax)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4bad4c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"descriptor_name",&local_59);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffd00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::operator=((string *)pmVar3,"DESCRIPTOR");
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  psVar4 = FileDescriptor::name_abi_cxx11_(*(FileDescriptor **)(in_RDI + 0x30));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"name",&local_91);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffd00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar4);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  psVar4 = FileDescriptor::package_abi_cxx11_(*(FileDescriptor **)(in_RDI + 0x30));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"package",&local_b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffd00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar4);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  FileDescriptor::syntax(*(FileDescriptor **)(in_RDI + 0x30));
  (anonymous_namespace)::StringifySyntax_abi_cxx11_(syntax);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"syntax",&local_101);
  this_00 = (Generator *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_fffffffffffffd00,
                         (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::operator=((string *)this_00,local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_e0);
  serialized_options = FileDescriptor::options(*(FileDescriptor **)(in_RDI + 0x30));
  MessageLite::SerializeAsString_abi_cxx11_(in_stack_fffffffffffffce8);
  OptionsValue(this_00,(string *)serialized_options);
  this_02 = (Printer *)&local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"options",(allocator *)this_02);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffd00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  args_1 = &local_128;
  std::__cxx11::string::operator=((string *)pmVar5,(string *)args_1);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)args_1);
  std::__cxx11::string::~string(local_148);
  this_01 = (Printer *)(local_218 + 0x20);
  memcpy(this_01,
         "$descriptor_name$ = _descriptor.FileDescriptor(\n  name=\'$name$\',\n  package=\'$package$\',\n  syntax=\'$syntax$\',\n  serialized_options=$options$,\n"
         ,0x8e);
  io::Printer::Print(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  io::Printer::Indent((Printer *)0x4bb0f5);
  strings::CHexEscape(pmVar3);
  io::Printer::Print<char[6],std::__cxx11::string>
            (this_02,(char *)pmVar5,&this_01->variable_delimiter_,args_1);
  std::__cxx11::string::~string(local_218);
  iVar1 = FileDescriptor::dependency_count(*(FileDescriptor **)(in_RDI + 0x30));
  if (iVar1 != 0) {
    io::Printer::Print<>(this_01,(char *)args_1);
    local_21c = 0;
    while( true ) {
      iVar1 = local_21c;
      iVar2 = FileDescriptor::dependency_count(*(FileDescriptor **)(in_RDI + 0x30));
      if (iVar2 <= iVar1) break;
      pFVar6 = FileDescriptor::dependency
                         ((FileDescriptor *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      FileDescriptor::name_abi_cxx11_(pFVar6);
      anon_unknown_0::ModuleAlias(in_stack_fffffffffffffd98);
      io::Printer::Print<char[13],std::__cxx11::string>
                (this_02,(char *)pmVar5,&this_01->variable_delimiter_,args_1);
      std::__cxx11::string::~string(local_240);
      local_21c = local_21c + 1;
    }
    io::Printer::Print<>(this_01,(char *)args_1);
  }
  iVar1 = FileDescriptor::public_dependency_count(*(FileDescriptor **)(in_RDI + 0x30));
  if (0 < iVar1) {
    io::Printer::Print<>(this_01,(char *)args_1);
    local_244 = 0;
    while( true ) {
      iVar1 = local_244;
      iVar2 = FileDescriptor::public_dependency_count(*(FileDescriptor **)(in_RDI + 0x30));
      if (iVar2 <= iVar1) break;
      pFVar6 = FileDescriptor::public_dependency
                         ((FileDescriptor *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      in_stack_fffffffffffffcc0 = FileDescriptor::name_abi_cxx11_(pFVar6);
      anon_unknown_0::ModuleAlias(in_stack_fffffffffffffd98);
      io::Printer::Print<char[13],std::__cxx11::string>
                (this_02,(char *)pmVar5,&this_01->variable_delimiter_,args_1);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
      local_244 = local_244 + 1;
    }
    io::Printer::Print<>(this_01,(char *)args_1);
  }
  io::Printer::Outdent(this_02);
  io::Printer::Print<>(this_01,(char *)args_1);
  io::Printer::Print<>(this_01,(char *)args_1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4bb61e);
  return;
}

Assistant:

void Generator::PrintFileDescriptor() const {
  std::map<std::string, std::string> m;
  m["descriptor_name"] = kDescriptorKey;
  m["name"] = file_->name();
  m["package"] = file_->package();
  m["syntax"] = StringifySyntax(file_->syntax());
  m["options"] = OptionsValue(file_->options().SerializeAsString());
  const char file_descriptor_template[] =
      "$descriptor_name$ = _descriptor.FileDescriptor(\n"
      "  name='$name$',\n"
      "  package='$package$',\n"
      "  syntax='$syntax$',\n"
      "  serialized_options=$options$,\n";
  printer_->Print(m, file_descriptor_template);
  printer_->Indent();
  printer_->Print(
      //##!PY25      "serialized_pb=b'$value$'\n",
      "serialized_pb=_b('$value$')\n",  //##PY25
      "value", strings::CHexEscape(file_descriptor_serialized_));
  if (file_->dependency_count() != 0) {
    printer_->Print(",\ndependencies=[");
    for (int i = 0; i < file_->dependency_count(); ++i) {
      std::string module_alias = ModuleAlias(file_->dependency(i)->name());
      printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                      module_alias);
    }
    printer_->Print("]");
  }
  if (file_->public_dependency_count() > 0) {
    printer_->Print(",\npublic_dependencies=[");
    for (int i = 0; i < file_->public_dependency_count(); ++i) {
      std::string module_alias =
          ModuleAlias(file_->public_dependency(i)->name());
      printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                      module_alias);
    }
    printer_->Print("]");
  }

  // TODO(falk): Also print options and fix the message_type, enum_type,
  //             service and extension later in the generation.

  printer_->Outdent();
  printer_->Print(")\n");
  printer_->Print("\n");
}